

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cc
# Opt level: O0

bool __thiscall Worker::start(Worker *this)

{
  bool bVar1;
  Worker *local_38;
  code *local_30;
  undefined8 local_28;
  thread local_20;
  Worker *local_18;
  Worker *this_local;
  
  bVar1 = this->socketfd_ != -1;
  if (bVar1) {
    this->alive_ = true;
    local_30 = work;
    local_28 = 0;
    local_38 = this;
    local_18 = this;
    std::thread::thread<void(Worker::*)(),Worker*,void>(&local_20,(type *)&local_30,&local_38);
    std::thread::operator=(&this->thread,&local_20);
    std::thread::~thread(&local_20);
  }
  return bVar1;
}

Assistant:

bool Worker::start()
{
    if (socketfd_ != -1)
    {
        this->alive_ = true;
        this->thread = std::thread(&Worker::work, this);
        return true;
    }

    return false;
}